

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O3

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  int *piVar1;
  bool bVar2;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  uint uVar5;
  uint uVar6;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x60,"Mvc_Cover_t *Mvc_CoverAlgebraicSubtract(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  pCover = Mvc_CoverClone(pCover1);
  pCube = (pCover1->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    do {
      pMVar3 = (pCover2->lCubes).pHead;
      if (pMVar3 != (Mvc_Cube_t *)0x0) {
        uVar5 = *(uint *)&pCube->field_0x8 & 0xffffff;
        do {
          if (uVar5 == 0) {
            if (pCube->pData[0] == pMVar3->pData[0]) goto LAB_0040d0ff;
          }
          else {
            uVar6 = uVar5;
            if (uVar5 == 1) {
              if ((pCube->pData[0] == pMVar3->pData[0]) &&
                 (*(int *)&pCube->field_0x14 == *(int *)&pMVar3->field_0x14)) goto LAB_0040d0ff;
            }
            else {
              while (pCube->pData[uVar6] == pMVar3->pData[uVar6]) {
                bVar2 = (int)uVar6 < 1;
                uVar6 = uVar6 - 1;
                if (bVar2) goto LAB_0040d0ff;
              }
            }
          }
          pMVar3 = pMVar3->pNext;
        } while (pMVar3 != (Mvc_Cube_t *)0x0);
      }
      pMVar4 = Mvc_CubeDup(pCover,pCube);
      pMVar3 = (Mvc_Cube_t *)&pCover->lCubes;
      if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
        pMVar3 = (pCover->lCubes).pTail;
      }
      pMVar3->pNext = pMVar4;
      (pCover->lCubes).pTail = pMVar4;
      pMVar4->pNext = (Mvc_Cube_t *)0x0;
      piVar1 = &(pCover->lCubes).nItems;
      *piVar1 = *piVar1 + 1;
LAB_0040d0ff:
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverAlgebraicSubtract( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube1, * pCube2, * pCube;
    int fFound;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );

    // iterate through the cubes
    pCover = Mvc_CoverClone( pCover1 );
    Mvc_CoverForEachCube( pCover1, pCube1 )
    {
        fFound = 0;
        Mvc_CoverForEachCube( pCover2, pCube2 )
        {
            Mvc_CubeBitEqual( CompResult, pCube1, pCube2 );
            if ( CompResult )
            {
                fFound = 1;
                break;
            }
        }
        if ( !fFound )
        { 
            // create the copy of the cube
            pCube = Mvc_CubeDup( pCover, pCube1 );
            // add the cube copy to the cover
            Mvc_CoverAddCubeTail( pCover, pCube );
        }
    }
    return pCover;
}